

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmCommonTargetGenerator::ComputeFortranModuleDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = this->GeneratorTarget;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Fortran_MODULE_DIRECTORY","")
  ;
  pcVar3 = cmGeneratorTarget::GetProperty(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_01 = this->Makefile;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"CMAKE_Fortran_MODDIR_FLAG","");
  pcVar4 = cmMakefile::GetDefinition(this_01,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar3 != (char *)0x0) && (pcVar4 != (char *)0x0)) {
    bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar3);
    if (bVar2) {
      pcVar4 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar4,(ulong)pcVar3);
    }
    else {
      pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory
                         (&this->LocalGenerator->super_cmLocalGenerator);
      pcVar3 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar3,(ulong)pcVar4);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    cmsys::SystemTools::MakeDirectory(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::ComputeFortranModuleDirectory() const
{
  std::string mod_dir;
  const char* target_mod_dir =
    this->GeneratorTarget->GetProperty("Fortran_MODULE_DIRECTORY");
  const char* moddir_flag =
    this->Makefile->GetDefinition("CMAKE_Fortran_MODDIR_FLAG");
  if(target_mod_dir && moddir_flag)
    {
    // Compute the full path to the module directory.
    if(cmSystemTools::FileIsFullPath(target_mod_dir))
      {
      // Already a full path.
      mod_dir = target_mod_dir;
      }
    else
      {
      // Interpret relative to the current output directory.
      mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
      mod_dir += "/";
      mod_dir += target_mod_dir;
      }

    // Make sure the module output directory exists.
    cmSystemTools::MakeDirectory(mod_dir);
    }
  return mod_dir;
}